

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausProcessClauses2(Clu_Man_t *p,int fRefs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  lit lVar4;
  int iVar5;
  Fra_Sml_t *pSeq_00;
  Fra_Sml_t *pSimMan;
  Aig_ManCut_t *p_00;
  abctime aVar6;
  Aig_Obj_t *pObj_00;
  abctime aVar7;
  sat_solver *psVar8;
  int *piVar9;
  int *pStart;
  int End;
  int Beg;
  int k_1;
  int RetValue;
  int ScoresComb [4096];
  int ScoresSeq [4096];
  abctime clk;
  int nCuts;
  int j;
  int k;
  int i;
  Aig_Cut_t *pCut;
  Aig_Obj_t *pObj;
  Fra_Sml_t *pSeq;
  Fra_Sml_t *pComb;
  Aig_ManCut_t *pManCut;
  int fRefs_local;
  Clu_Man_t *p_local;
  
  clk._0_4_ = 0;
  if (0xc < p->nLutSize) {
    __assert_fail("p->nLutSize < 13",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                  ,0x2de,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
  }
  Abc_Clock();
  Aig_ManRandom(1);
  pSeq_00 = Fra_SmlSimulateSeq(p->pAig,0,p->nPref + p->nSimFrames,p->nSimWords / p->nSimFrames,1);
  if ((p->fTarget == 0) || (pSeq_00->fNonConstOut == 0)) {
    Abc_Clock();
    Aig_ManRandom(1);
    pSimMan = Fra_SmlSimulateComb(p->pAig,p->nSimWords + p->nSimWordsPref,0);
    Abc_Clock();
    if (fRefs != 0) {
      Fra_ClausCollectLatchClauses(p,pSeq_00);
    }
    Abc_Clock();
    p_00 = Aig_ComputeCuts(p->pAig,p->nCutsMax,p->nLutSize,0,p->fVerbose);
    aVar6 = Abc_Clock();
    for (j = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), j < iVar1; j = j + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,j);
      if (((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) &&
         (((uint)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x20) & 0xffffff) <=
          (uint)p->nLevels)) {
        nCuts = 0;
        _k = Aig_ObjCuts(p_00,pObj_00);
        while (nCuts < p_00->nCutsMax) {
          if ('\x01' < _k->nFanins) {
            clk._0_4_ = (uint)clk + 1;
            Fra_ClausProcessClausesCut3(p,pSeq_00,_k,ScoresComb + 0xffe);
            Fra_ClausProcessClausesCut3(p,pSimMan,_k,&k_1);
            for (clk._4_4_ = 0; clk._4_4_ < 1 << (_k->nFanins & 0x1fU); clk._4_4_ = clk._4_4_ + 1) {
              if (((&k_1)[clk._4_4_] != 0) && (ScoresComb[(long)clk._4_4_ + 0xffe] == 0)) {
                Fra_ClausRecordClause2(p,_k,clk._4_4_,(&k_1)[clk._4_4_]);
              }
            }
          }
          nCuts = nCuts + 1;
          _k = Aig_CutNext(_k);
        }
      }
    }
    Fra_SmlStop(pSeq_00);
    Fra_SmlStop(pSimMan);
    p->nCuts = (uint)clk;
    Aig_ManCutStop(p_00);
    p->pAig->pManCuts = (void *)0x0;
    if (p->fVerbose != 0) {
      uVar2 = Aig_ManNodeNum(p->pAig);
      uVar3 = Vec_IntSize(p->vClauses);
      iVar1 = Vec_IntSize(p->vClauses);
      printf("Node = %5d. Cuts = %7d. Clauses = %6d. Clause/cut = %6.2f.\n",
             ((double)iVar1 * 1.0) / (double)(int)(uint)clk,(ulong)uVar2,(ulong)(uint)clk,
             (ulong)uVar3);
      Abc_Print(1,"%s =","Processing sim-info to find candidate clauses (unoptimized)");
      aVar7 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
    }
    if (p->nClauses != 0) {
      __assert_fail("p->nClauses == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                    ,0x331,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
    }
    iVar1 = Vec_IntSize(p->vClauses);
    p->nClauses = iVar1;
    iVar1 = Vec_IntSize(p->vClausesProven);
    if (0 < iVar1) {
      pStart._0_4_ = -1;
      if (p->pSatMain != (sat_solver *)0x0) {
        sat_solver_delete(p->pSatMain);
      }
      psVar8 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,1,0);
      p->pSatMain = psVar8;
      if (p->pSatMain == (sat_solver *)0x0) {
        printf("Error: Main solver is unsat.\n");
        return -1;
      }
      pStart._4_4_ = 0;
      piVar9 = Vec_IntArray(p->vLitsProven);
      for (j = 0; iVar1 = Vec_IntSize(p->vClausesProven), j < iVar1; j = j + 1) {
        pStart._0_4_ = Vec_IntEntry(p->vClausesProven,j);
        if (p->nLutSize < (int)pStart - pStart._4_4_) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                        ,0x346,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
        }
        iVar1 = sat_solver_addclause(p->pSatMain,piVar9 + pStart._4_4_,piVar9 + (int)pStart);
        if (iVar1 == 0) {
          printf("Error: Solver is UNSAT after adding assumption clauses.\n");
          return -1;
        }
        pStart._4_4_ = (int)pStart;
      }
      iVar1 = Vec_IntSize(p->vLitsProven);
      if ((int)pStart != iVar1) {
        __assert_fail("End == Vec_IntSize(p->vLitsProven)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x350,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
      }
      pStart._4_4_ = 0;
      piVar9 = Vec_IntArray(p->vLits);
      for (j = 0; iVar1 = Vec_IntSize(p->vClauses), j < iVar1; j = j + 1) {
        pStart._0_4_ = Vec_IntEntry(p->vClauses,j);
        iVar1 = Vec_IntEntry(p->vCosts,j);
        if (iVar1 < 0) {
          __assert_fail("Vec_IntEntry( p->vCosts, i ) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                        ,0x357,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
        }
        if (p->nLutSize < (int)pStart - pStart._4_4_) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                        ,0x358,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
        }
        for (End = pStart._4_4_; End < (int)pStart; End = End + 1) {
          lVar4 = lit_neg(piVar9[End]);
          piVar9[End] = lVar4;
        }
        iVar1 = sat_solver_solve(p->pSatMain,piVar9 + pStart._4_4_,piVar9 + (int)pStart,
                                 (long)p->nBTLimit,0,0,0);
        for (End = pStart._4_4_; End < (int)pStart; End = End + 1) {
          lVar4 = lit_neg(piVar9[End]);
          piVar9[End] = lVar4;
        }
        if (iVar1 == -1) {
          Vec_IntWriteEntry(p->vCosts,j,-1);
          p->nClauses = p->nClauses + -1;
        }
        pStart._4_4_ = (int)pStart;
      }
      iVar1 = Vec_IntSize(p->vLits);
      if ((int)pStart != iVar1) {
        __assert_fail("End == Vec_IntSize(p->vLits)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x367,"int Fra_ClausProcessClauses2(Clu_Man_t *, int)");
      }
      if (p->fVerbose != 0) {
        iVar5 = Vec_IntSize(p->vClauses);
        iVar1 = p->nClauses;
        uVar2 = Vec_IntSize(p->vClauses);
        printf("Already proved clauses filtered out %d candidate clauses (out of %d).\n",
               (ulong)(uint)(iVar5 - iVar1),(ulong)uVar2);
      }
    }
    p->fFiltering = 0;
    if (p->nClausesMax < p->nClauses) {
      Fra_ClausSelectClauses(p);
      p->fFiltering = 1;
    }
    p_local._4_4_ = 1;
  }
  else {
    printf("Property failed after sequential simulation!\n");
    Fra_SmlStop(pSeq_00);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClausProcessClauses2( Clu_Man_t * p, int fRefs )
{
//    Aig_MmFixed_t * pMemCuts;
    Aig_ManCut_t * pManCut;
    Fra_Sml_t * pComb, * pSeq;
    Aig_Obj_t * pObj;
    Aig_Cut_t * pCut;
    int i, k, j, nCuts = 0;
    abctime clk;
    int ScoresSeq[1<<12], ScoresComb[1<<12];
    assert( p->nLutSize < 13 );

    // simulate the AIG
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pSeq = Fra_SmlSimulateSeq( p->pAig, 0, p->nPref + p->nSimFrames, p->nSimWords/p->nSimFrames, 1  );
    if ( p->fTarget && pSeq->fNonConstOut )
    {
        printf( "Property failed after sequential simulation!\n" );
        Fra_SmlStop( pSeq );
        return 0;
    }
if ( p->fVerbose )
{
//ABC_PRT( "Sim-seq", Abc_Clock() - clk );
}

    // perform combinational simulation
clk = Abc_Clock();
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    pComb = Fra_SmlSimulateComb( p->pAig, p->nSimWords + p->nSimWordsPref, 0 );
if ( p->fVerbose )
{
//ABC_PRT( "Sim-cmb", Abc_Clock() - clk );
}


clk = Abc_Clock();
    if ( fRefs )
    {
    Fra_ClausCollectLatchClauses( p, pSeq );
if ( p->fVerbose )
{
//ABC_PRT( "Lat-cla", Abc_Clock() - clk );
}
    }


    // generate cuts for all nodes, assign cost, and find best cuts
clk = Abc_Clock();
//    pMemCuts = Dar_ManComputeCuts( p->pAig, 10, 0, 1 );
    pManCut = Aig_ComputeCuts( p->pAig, p->nCutsMax, p->nLutSize, 0, p->fVerbose );
if ( p->fVerbose )
{
//ABC_PRT( "Cuts   ", Abc_Clock() - clk );
}

    // collect combinational info for each cut
clk = Abc_Clock();
    Aig_ManForEachNode( p->pAig, pObj, i )
    {
        if ( pObj->Level > (unsigned)p->nLevels )
            continue;
        Aig_ObjForEachCut( pManCut, pObj, pCut, k )
            if ( pCut->nFanins > 1 )
            {
                nCuts++;
                Fra_ClausProcessClausesCut3( p, pSeq, pCut, ScoresSeq );
                Fra_ClausProcessClausesCut3( p, pComb, pCut, ScoresComb );
                // write the clauses
                for ( j = 0; j < (1<<pCut->nFanins); j++ )
                    if ( ScoresComb[j] != 0 && ScoresSeq[j] == 0 )
                        Fra_ClausRecordClause2( p, pCut, j, ScoresComb[j] );

            }
    }
    Fra_SmlStop( pSeq );
    Fra_SmlStop( pComb );
    p->nCuts = nCuts;
//    Aig_MmFixedStop( pMemCuts, 0 );
    Aig_ManCutStop( pManCut );
    p->pAig->pManCuts = NULL;

    if ( p->fVerbose )
    {
    printf( "Node = %5d. Cuts = %7d. Clauses = %6d. Clause/cut = %6.2f.\n", 
        Aig_ManNodeNum(p->pAig), nCuts, Vec_IntSize(p->vClauses), 1.0*Vec_IntSize(p->vClauses)/nCuts );
    ABC_PRT( "Processing sim-info to find candidate clauses (unoptimized)", Abc_Clock() - clk );
    }

    // filter out clauses that are contained in the already proven clauses
    assert( p->nClauses == 0 );
    p->nClauses = Vec_IntSize( p->vClauses );
    if ( Vec_IntSize( p->vClausesProven ) > 0 )
    {
        int RetValue, k, Beg;
        int End = -1; // Suppress "might be used uninitialized"
        int * pStart;
        // reset the solver
        if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
        p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, 1, 0 );
        if ( p->pSatMain == NULL )
        {
            printf( "Error: Main solver is unsat.\n" );
            return -1;
        }  

        // add the proven clauses
        Beg = 0;
        pStart = Vec_IntArray(p->vLitsProven);
        Vec_IntForEachEntry( p->vClausesProven, End, i )
        {
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        assert( End == Vec_IntSize(p->vLitsProven) );

        // check the clauses
        Beg = 0;
        pStart = Vec_IntArray(p->vLits);
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            assert( Vec_IntEntry( p->vCosts, i ) >= 0 );
            assert( End - Beg <= p->nLutSize );
            // check the clause
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            RetValue = sat_solver_solve( p->pSatMain, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            // the clause holds
            if ( RetValue == l_False )
            {
                Vec_IntWriteEntry( p->vCosts, i, -1 );
                p->nClauses--;
            }
            Beg = End;
        }
        assert( End == Vec_IntSize(p->vLits) );
        if ( p->fVerbose )
        printf( "Already proved clauses filtered out %d candidate clauses (out of %d).\n", 
            Vec_IntSize(p->vClauses) - p->nClauses, Vec_IntSize(p->vClauses) );
    }

    p->fFiltering = 0;
    if ( p->nClauses > p->nClausesMax )
    {
        Fra_ClausSelectClauses( p );
        p->fFiltering = 1;
    }
    return 1;
}